

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O0

int32_t __thiscall
icu_63::RuleBasedCollator::internalNextSortKeyPart
          (RuleBasedCollator *this,UCharIterator *iter,uint32_t *state,uint8_t *dest,int32_t count,
          UErrorCode *errorCode)

{
  UBool UVar1;
  UBool UVar2;
  Level LVar3;
  uint32_t uVar4;
  int iVar5;
  int32_t iVar6;
  char16_t *s_00;
  int local_468;
  int32_t i;
  int32_t length;
  UChar *sArray;
  undefined1 local_450 [4];
  UChar32 c;
  UnicodeString s;
  int32_t levelCapacity;
  FCDUIterCollationIterator ci_1;
  UIterCollationIterator ci;
  PartLevelCallback callback;
  Level local_70;
  UBool numeric;
  Level level;
  undefined1 local_60 [8];
  FixedSortKeyByteSink sink;
  UErrorCode *errorCode_local;
  int32_t count_local;
  uint8_t *dest_local;
  uint32_t *state_local;
  UCharIterator *iter_local;
  RuleBasedCollator *this_local;
  
  sink.super_SortKeyByteSink._24_8_ = errorCode;
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 != '\0') {
    return 0;
  }
  if ((((iter == (UCharIterator *)0x0) || (state == (uint32_t *)0x0)) || (count < 0)) ||
     ((0 < count && (dest == (uint8_t *)0x0)))) {
    *(undefined4 *)sink.super_SortKeyByteSink._24_8_ = 1;
    return 0;
  }
  if (count == 0) {
    return 0;
  }
  anon_unknown_16::FixedSortKeyByteSink::FixedSortKeyByteSink
            ((FixedSortKeyByteSink *)local_60,(char *)dest,count);
  SortKeyByteSink::IgnoreBytes((SortKeyByteSink *)local_60,state[1]);
  (*iter->move)(iter,0,UITER_START);
  local_70 = *state;
  if ((int)local_70 < 6) {
    UVar1 = CollationSettings::isNumeric(this->settings);
    anon_unknown_16::PartLevelCallback::PartLevelCallback
              ((PartLevelCallback *)&ci.iter,(SortKeyByteSink *)local_60);
    UVar2 = CollationSettings::dontCheckFCD(this->settings);
    if (UVar2 == '\0') {
      FCDUIterCollationIterator::FCDUIterCollationIterator
                ((FCDUIterCollationIterator *)&levelCapacity,this->data,UVar1,iter,0);
      CollationKeys::writeSortKeyUpToQuaternary
                ((CollationIterator *)&levelCapacity,this->data->compressibleBytes,this->settings,
                 (SortKeyByteSink *)local_60,local_70,(LevelCallback *)&ci.iter,'\0',
                 (UErrorCode *)sink.super_SortKeyByteSink._24_8_);
      FCDUIterCollationIterator::~FCDUIterCollationIterator
                ((FCDUIterCollationIterator *)&levelCapacity);
    }
    else {
      UIterCollationIterator::UIterCollationIterator
                ((UIterCollationIterator *)((long)&ci_1.normalized.fUnion + 0x30),this->data,UVar1,
                 iter);
      CollationKeys::writeSortKeyUpToQuaternary
                ((CollationIterator *)((long)&ci_1.normalized.fUnion + 0x30),
                 this->data->compressibleBytes,this->settings,(SortKeyByteSink *)local_60,local_70,
                 (LevelCallback *)&ci.iter,'\0',(UErrorCode *)sink.super_SortKeyByteSink._24_8_);
      UIterCollationIterator::~UIterCollationIterator
                ((UIterCollationIterator *)((long)&ci_1.normalized.fUnion + 0x30));
    }
    UVar1 = ::U_FAILURE(*(UErrorCode *)sink.super_SortKeyByteSink._24_8_);
    if (UVar1 == '\0') {
      iVar6 = SortKeyByteSink::NumberOfBytesAppended((SortKeyByteSink *)local_60);
      if (count < iVar6) {
        LVar3 = anon_unknown_16::PartLevelCallback::getLevel((PartLevelCallback *)&ci.iter);
        *state = LVar3;
        uVar4 = anon_unknown_16::PartLevelCallback::getLevelCapacity((PartLevelCallback *)&ci.iter);
        state[1] = uVar4;
        s.fUnion._52_4_ = 1;
        this_local._4_4_ = count;
      }
      else {
        iVar6 = CollationSettings::getStrength(this->settings);
        if (iVar6 == 0xf) {
          local_70 = IDENTICAL_LEVEL;
          (*iter->move)(iter,0,UITER_START);
        }
        s.fUnion._52_4_ = 0;
      }
    }
    else {
      this_local._4_4_ = 0;
      s.fUnion._52_4_ = 1;
    }
    anon_unknown_16::PartLevelCallback::~PartLevelCallback((PartLevelCallback *)&ci.iter);
    if (s.fUnion._52_4_ != 0) goto LAB_0028e906;
  }
  if (local_70 == IDENTICAL_LEVEL) {
    s.fUnion._48_4_ = SortKeyByteSink::GetRemainingCapacity((SortKeyByteSink *)local_60);
    icu_63::UnicodeString::UnicodeString((UnicodeString *)local_450);
    while (iVar5 = (*(code *)iter->next)(), -1 < iVar5) {
      sArray._4_2_ = (char16_t)iVar5;
      icu_63::UnicodeString::append((UnicodeString *)local_450,sArray._4_2_);
    }
    s_00 = icu_63::UnicodeString::getBuffer((UnicodeString *)local_450);
    iVar6 = icu_63::UnicodeString::length((UnicodeString *)local_450);
    writeIdenticalLevel(this,s_00,s_00 + iVar6,(SortKeyByteSink *)local_60,
                        (UErrorCode *)sink.super_SortKeyByteSink._24_8_);
    UVar1 = ::U_FAILURE(*(UErrorCode *)sink.super_SortKeyByteSink._24_8_);
    if (UVar1 == '\0') {
      iVar6 = SortKeyByteSink::NumberOfBytesAppended((SortKeyByteSink *)local_60);
      if (count < iVar6) {
        *state = 6;
        state[1] = s.fUnion._48_4_;
        s.fUnion._52_4_ = 1;
        this_local._4_4_ = count;
      }
      else {
        s.fUnion._52_4_ = 0;
      }
    }
    else {
      this_local._4_4_ = 0;
      s.fUnion._52_4_ = 1;
    }
    icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_450);
    if (s.fUnion._52_4_ != 0) goto LAB_0028e906;
  }
  *state = 7;
  state[1] = 0;
  this_local._4_4_ = SortKeyByteSink::NumberOfBytesAppended((SortKeyByteSink *)local_60);
  local_468 = this_local._4_4_;
  while (local_468 < count) {
    dest[local_468] = '\0';
    local_468 = local_468 + 1;
  }
  s.fUnion._52_4_ = 1;
LAB_0028e906:
  anon_unknown_16::FixedSortKeyByteSink::~FixedSortKeyByteSink((FixedSortKeyByteSink *)local_60);
  return this_local._4_4_;
}

Assistant:

int32_t
RuleBasedCollator::internalNextSortKeyPart(UCharIterator *iter, uint32_t state[2],
                                           uint8_t *dest, int32_t count, UErrorCode &errorCode) const {
    if(U_FAILURE(errorCode)) { return 0; }
    if(iter == NULL || state == NULL || count < 0 || (count > 0 && dest == NULL)) {
        errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }
    if(count == 0) { return 0; }

    FixedSortKeyByteSink sink(reinterpret_cast<char *>(dest), count);
    sink.IgnoreBytes((int32_t)state[1]);
    iter->move(iter, 0, UITER_START);

    Collation::Level level = (Collation::Level)state[0];
    if(level <= Collation::QUATERNARY_LEVEL) {
        UBool numeric = settings->isNumeric();
        PartLevelCallback callback(sink);
        if(settings->dontCheckFCD()) {
            UIterCollationIterator ci(data, numeric, *iter);
            CollationKeys::writeSortKeyUpToQuaternary(ci, data->compressibleBytes, *settings,
                                                      sink, level, callback, FALSE, errorCode);
        } else {
            FCDUIterCollationIterator ci(data, numeric, *iter, 0);
            CollationKeys::writeSortKeyUpToQuaternary(ci, data->compressibleBytes, *settings,
                                                      sink, level, callback, FALSE, errorCode);
        }
        if(U_FAILURE(errorCode)) { return 0; }
        if(sink.NumberOfBytesAppended() > count) {
            state[0] = (uint32_t)callback.getLevel();
            state[1] = (uint32_t)callback.getLevelCapacity();
            return count;
        }
        // All of the normal levels are done.
        if(settings->getStrength() == UCOL_IDENTICAL) {
            level = Collation::IDENTICAL_LEVEL;
            iter->move(iter, 0, UITER_START);
        }
        // else fall through to setting ZERO_LEVEL
    }

    if(level == Collation::IDENTICAL_LEVEL) {
        int32_t levelCapacity = sink.GetRemainingCapacity();
        UnicodeString s;
        for(;;) {
            UChar32 c = iter->next(iter);
            if(c < 0) { break; }
            s.append((UChar)c);
        }
        const UChar *sArray = s.getBuffer();
        writeIdenticalLevel(sArray, sArray + s.length(), sink, errorCode);
        if(U_FAILURE(errorCode)) { return 0; }
        if(sink.NumberOfBytesAppended() > count) {
            state[0] = (uint32_t)level;
            state[1] = (uint32_t)levelCapacity;
            return count;
        }
    }

    // ZERO_LEVEL: Fill the remainder of dest with 00 bytes.
    state[0] = (uint32_t)Collation::ZERO_LEVEL;
    state[1] = 0;
    int32_t length = sink.NumberOfBytesAppended();
    int32_t i = length;
    while(i < count) { dest[i++] = 0; }
    return length;
}